

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_type_enum_value_pos
                 (lysp_ctx *ctx,lysp_stmt *stmt,int64_t *value,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulonglong uVar6;
  ulonglong uVar7;
  char *pcVar8;
  char *format;
  ly_stmt insubstmt;
  ly_ctx *plVar9;
  lysp_stmt *stmt_00;
  char *ptr;
  char *local_40;
  int *local_38;
  
  local_40 = (char *)0x0;
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = lyplg_ext_stmt2str(stmt->kw);
    ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar8);
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar1 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  pcVar8 = stmt->arg;
  sVar4 = strlen(pcVar8);
  iVar2 = (int)sVar4;
  if ((((iVar2 == 0) || (*pcVar8 == '+')) || (1 < iVar2 && *pcVar8 == '0')) ||
     ((stmt->kw == LY_STMT_POSITION && (iVar3 = strncmp(pcVar8,"-0",2), iVar3 == 0)))) {
LAB_00171038:
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar5 = lyplg_ext_stmt2str(stmt->kw);
    format = "Invalid value \"%.*s\" of \"%s\".";
  }
  else {
    local_38 = __errno_location();
    *local_38 = 0;
    if (stmt->kw == LY_STMT_VALUE) {
      uVar6 = strtoll(pcVar8,&local_40,10);
      if ((long)(int)uVar6 == uVar6) {
        uVar7 = 0;
LAB_0017115b:
        pcVar8 = stmt->arg;
        if ((long)local_40 - (long)pcVar8 == (long)iVar2) {
          if (*local_38 != 0x22) {
            if (stmt->kw == LY_STMT_VALUE) {
              uVar7 = uVar6;
            }
            *value = uVar7;
            stmt_00 = stmt->child;
            if (stmt_00 != (lysp_stmt *)0x0) {
              while( true ) {
                if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar9 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar9 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar8 = lyplg_ext_stmt2str(stmt_00->kw);
                  pcVar5 = lyplg_ext_stmt2str(stmt->kw);
                  ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar8,pcVar5);
                  return LY_EVALID;
                }
                insubstmt = stmt->kw;
                if (insubstmt != LY_STMT_VALUE) {
                  insubstmt = LY_STMT_POSITION;
                }
                LVar1 = lysp_stmt_ext(ctx,stmt_00,insubstmt,0,exts);
                if (LVar1 != LY_SUCCESS) break;
                stmt_00 = stmt_00->next;
                if (stmt_00 == (lysp_stmt *)0x0) {
                  return LY_SUCCESS;
                }
              }
              return LVar1;
            }
            return LY_SUCCESS;
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(stmt->kw);
          format = "Value \"%.*s\" is out of \"%s\" bounds.";
          goto LAB_001710a6;
        }
        goto LAB_00171038;
      }
    }
    else {
      uVar7 = strtoull(pcVar8,&local_40,10);
      if (uVar7 >> 0x20 == 0) {
        uVar6 = 0;
        goto LAB_0017115b;
      }
    }
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = stmt->arg;
    pcVar5 = lyplg_ext_stmt2str(stmt->kw);
    format = "Invalid value \"%.*s\" of \"%s\".";
  }
LAB_001710a6:
  ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar4,pcVar8,pcVar5);
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum_value_pos(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, int64_t *value, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr = NULL;
    long long num = 0;
    unsigned long long unum = 0;

    if (*flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(stmt->kw));
        return LY_EVALID;
    }
    *flags |= LYS_SET_VALUE;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    arg_len = strlen(stmt->arg);
    if (!arg_len || (stmt->arg[0] == '+') || ((stmt->arg[0] == '0') && (arg_len > 1)) ||
            ((stmt->kw == LY_STMT_POSITION) && !strncmp(stmt->arg, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }

    errno = 0;
    if (stmt->kw == LY_STMT_VALUE) {
        num = strtoll(stmt->arg, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    } else {
        unum = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    }
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (stmt->kw == LY_STMT_VALUE) {
        *value = num;
    } else {
        *value = unum;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw == LY_STMT_VALUE ? LY_STMT_VALUE : LY_STMT_POSITION, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;

error:
    return LY_EVALID;
}